

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c
# Opt level: O0

Node * prvTidyFindHTML(TidyDocImpl *doc)

{
  bool bVar1;
  Node *local_20;
  Node *local_18;
  Node *node;
  TidyDocImpl *doc_local;
  
  if (doc == (TidyDocImpl *)0x0) {
    local_20 = (Node *)0x0;
  }
  else {
    local_20 = (doc->root).content;
  }
  local_18 = local_20;
  while( true ) {
    bVar1 = false;
    if (local_18 != (Node *)0x0) {
      bVar1 = false;
      if ((local_18 != (Node *)0x0) && (bVar1 = false, local_18->tag != (Dict *)0x0)) {
        bVar1 = local_18->tag->id == TidyTag_HTML;
      }
      bVar1 = (bool)(bVar1 ^ 1);
    }
    if (!bVar1) break;
    local_18 = local_18->next;
  }
  return local_18;
}

Assistant:

Node *TY_(FindHTML)( TidyDocImpl* doc )
{
    Node *node;
    for ( node = (doc ? doc->root.content : NULL);
          node && !nodeIsHTML(node); 
          node = node->next )
        /**/;

    return node;
}